

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

bool __thiscall
MakefileGenerator::verifyExtraCompiler
          (MakefileGenerator *this,ProString *comp,QString *file_unfixed)

{
  QString string;
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  QList<ProString> *pQVar5;
  qsizetype qVar6;
  ProStringList *pPVar7;
  QString *pQVar8;
  undefined1 *puVar9;
  ProStringList *pPVar10;
  ProString *pPVar11;
  ProString *pPVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  ProString verify;
  ProString tmp_out;
  undefined8 in_stack_fffffffffffffd98;
  QList<ProString> *pQVar18;
  undefined2 in_stack_fffffffffffffda0;
  short sVar19;
  undefined2 uVar20;
  undefined6 in_stack_fffffffffffffda2;
  undefined6 uVar21;
  qsizetype in_stack_fffffffffffffda8;
  QMakeProject *pQVar22;
  ProString local_228;
  QArrayDataPointer<ProString> local_1f8;
  QString local_1d8;
  QString local_1b8;
  QString local_1a0;
  QArrayDataPointer<ProString> local_188;
  QArrayDataPointer<ProStringList> local_168;
  QArrayDataPointer<ProString> local_148;
  QArrayDataPointer<ProString> local_128;
  undefined1 local_108 [32];
  undefined1 *puStack_e8;
  undefined1 *local_e0;
  QArrayDataPointer<ProString> local_d8;
  undefined1 local_b8 [32];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 local_88 [28];
  int iStack_6c;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->no_io != false) {
    bVar1 = false;
    goto LAB_001626fa;
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = (file_unfixed->d).d;
  local_88._8_8_ = (file_unfixed->d).ptr;
  local_88._16_8_ = (file_unfixed->d).size;
  if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
    LOCK();
    (((Type *)&(((ProString *)local_88._0_8_)->m_string).d.d)->super___atomic_base<int>)._M_i =
         (((Type *)&(((ProString *)local_88._0_8_)->m_string).d.d)->super___atomic_base<int>)._M_i +
         1;
    UNLOCK();
  }
  string.d.ptr._0_2_ = in_stack_fffffffffffffda0;
  string.d.d = (Data *)in_stack_fffffffffffffd98;
  string.d.ptr._2_6_ = in_stack_fffffffffffffda2;
  string.d.size = in_stack_fffffffffffffda8;
  Option::fixString(&local_58,string,(uchar)local_88);
  if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_88._0_8_)->d).d = *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  pQVar22 = this->project;
  local_b8._8_8_ = ".CONFIG";
  local_b8._0_8_ = comp;
  ProString::ProString<ProString_const&,char_const(&)[8]>
            ((ProString *)local_88,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)local_b8)
  ;
  pQVar5 = &QMakeEvaluator::valuesRef(&pQVar22->super_QMakeEvaluator,(ProKey *)local_88)->
            super_QList<ProString>;
  if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_88._0_8_)->d).d = *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  qVar6 = QtPrivate::indexOf<ProString,char[11]>(pQVar5,(char (*) [11])"moc_verify",0);
  if (qVar6 == -1) {
    qVar6 = QtPrivate::indexOf<ProString,char[16]>(pQVar5,(char (*) [16])"function_verify",0);
    if (qVar6 == -1) {
      qVar6 = QtPrivate::indexOf<ProString,char[7]>(pQVar5,(char (*) [7])0x2a8da5,0);
      if (qVar6 == -1) goto LAB_001626ca;
      local_108._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar22 = this->project;
      local_228.m_string.d.ptr = L".output";
      local_228.m_string.d.d = (Data *)comp;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                ((ProString *)local_b8,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_228);
      QMakeEvaluator::first((ProString *)local_88,&pQVar22->super_QMakeEvaluator,(ProKey *)local_b8)
      ;
      ProString::toQString((QString *)local_108,(ProString *)local_88);
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_b8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_b8._0_8_)->d).d =
             *(int *)&(((QString *)local_b8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_b8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      if ((undefined1 *)local_108._16_8_ == (undefined1 *)0x0) {
LAB_00162625:
        if ((ProString *)local_108._0_8_ == (ProString *)0x0) goto LAB_001626cf;
        LOCK();
        ((__atomic_base<int> *)&(((QString *)local_108._0_8_)->d).d)->_M_i =
             ((__atomic_base<int> *)&(((QString *)local_108._0_8_)->d).d)->_M_i + -1;
        iVar3 = ((__atomic_base<int> *)&(((QString *)local_108._0_8_)->d).d)->_M_i;
        UNLOCK();
        pPVar11 = (ProString *)local_108._0_8_;
        goto joined_r0x00162639;
      }
      local_228.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_228.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_228.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar22 = this->project;
      local_b8._8_8_ = ".commands";
      local_b8._0_8_ = comp;
      ProString::ProString<ProString_const&,char_const(&)[10]>
                ((ProString *)local_88,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)local_b8);
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar22->super_QMakeEvaluator,(ProKey *)local_88);
      ProStringList::join(&local_228.m_string,pPVar7,(QChar)0x20);
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      qVar6 = QtPrivate::indexOf<ProString,char[8]>(pQVar5,(char (*) [8])"combine",0);
      if (qVar6 != -1) {
        local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = (ProString *)0x0;
        local_b8._8_8_ = (QString *)0x0;
        local_b8._16_8_ = (undefined1 *)0x0;
        replaceExtraCompilerVariables
                  ((QString *)local_88,this,&local_228.m_string,(QString *)local_b8,
                   (QString *)local_108,LocalShell);
        if ((ProString *)local_b8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8._0_8_)->d).d =
               *(int *)&(((QString *)local_b8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_b8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
          }
        }
        QString::toLatin1_helper((QString *)local_b8);
        pQVar8 = (QString *)local_b8._8_8_;
        if ((QString *)local_b8._8_8_ == (QString *)0x0) {
          pQVar8 = (QString *)&QByteArray::_empty;
        }
        iVar3 = system((char *)pQVar8);
        if ((ProString *)local_b8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8._0_8_)->d).d =
               *(int *)&(((QString *)local_b8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_b8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8._0_8_,1,0x10);
          }
        }
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if (iVar3 == 0) {
          if ((ProString *)local_228.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_228.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_228.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_228.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_228.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((ProString *)local_108._0_8_ != (ProString *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&(((QString *)local_108._0_8_)->d).d)->_M_i =
                 ((__atomic_base<int> *)&(((QString *)local_108._0_8_)->d).d)->_M_i + -1;
            iVar3 = ((__atomic_base<int> *)&(((QString *)local_108._0_8_)->d).d)->_M_i;
            UNLOCK();
            pPVar11 = (ProString *)local_108._0_8_;
            goto joined_r0x00162bc3;
          }
          goto LAB_001626ca;
        }
        if ((ProString *)local_228.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_228.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_228.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_228.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_228.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        goto LAB_00162625;
      }
      pQVar22 = this->project;
      local_b8._8_8_ = ".input";
      local_b8._0_8_ = comp;
      ProString::ProString<ProString_const&,char_const(&)[7]>
                ((ProString *)local_88,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)local_b8);
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar22->super_QMakeEvaluator,(ProKey *)local_88);
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      bVar1 = true;
      if ((pPVar7->super_QList<ProString>).d.size != 0) {
        pPVar11 = (pPVar7->super_QList<ProString>).d.ptr;
        uVar20 = SUB82(pPVar7,0);
        uVar21 = (undefined6)((ulong)pPVar7 >> 0x10);
        do {
          pPVar10 = QMakeEvaluator::valuesRef
                              (&this->project->super_QMakeEvaluator,(ProKey *)pPVar11);
          if ((pPVar10->super_QList<ProString>).d.size != 0) {
            pPVar12 = (pPVar10->super_QList<ProString>).d.ptr;
            do {
              if (pPVar12->m_length != 0) {
                local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_d8.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
                ProString::toQString((QString *)&local_d8,pPVar12);
                local_128.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_128.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
                fileFixify((QString *)&local_128,this,(QString *)&local_d8,(FileFixifyTypes)0x0,true
                          );
                iVar3 = 0;
                if ((local_128.size == local_58.d.size) &&
                   (QVar15.m_data = (storage_type_conflict *)local_128.ptr,
                   QVar15.m_size = local_128.size, QVar17.m_data = local_58.d.ptr,
                   QVar17.m_size = local_58.d.size, cVar2 = QtPrivate::equalStrings(QVar15,QVar17),
                   iVar3 = 0, cVar2 != '\0')) {
                  local_148.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_148.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
                  local_168.size = 0;
                  local_168.d = (Data *)0x0;
                  local_168.ptr = (ProStringList *)0x0;
                  local_88._0_8_ = (Data *)0x0;
                  local_88._8_8_ = (QString *)0x0;
                  local_88._16_8_ = 0;
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)local_88,0,(QString *)&local_d8);
                  QList<QString>::end((QList<QString> *)local_88);
                  local_b8._0_8_ = (ProString *)0x0;
                  local_b8._8_8_ = (QString *)0x0;
                  local_b8._16_8_ = 0;
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)local_b8,0,(QString *)&local_168);
                  QList<QString>::end((QList<QString> *)local_b8);
                  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xb])
                            (&local_148,this,local_108,(QArrayDataPointer<QString> *)local_88,
                             (QArrayDataPointer<QString> *)local_b8,0);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)local_b8);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)local_88);
                  if (&(local_168.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_168.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_168.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_168.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_168.d)->super_QArrayData,2,0x10);
                    }
                  }
                  local_168.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_168.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_168.ptr = (ProStringList *)&DAT_aaaaaaaaaaaaaaaa;
                  local_88._0_8_ = (ProString *)0x0;
                  local_88._8_8_ = (QString *)0x0;
                  local_88._16_8_ = (undefined1 *)0x0;
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)local_88,0,(QString *)&local_128);
                  QList<QString>::end((QList<QString> *)local_88);
                  local_b8._0_8_ = (ProString *)0x0;
                  local_b8._8_8_ = (QString *)0x0;
                  local_b8._16_8_ = (undefined1 *)0x0;
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)local_b8,0,(QString *)&local_148);
                  QList<QString>::end((QList<QString> *)local_b8);
                  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xb])
                            (&local_168,this,&local_228,(QArrayDataPointer<QString> *)local_88,
                             (QArrayDataPointer<QString> *)local_b8);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)local_b8);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)local_88);
                  QString::toLatin1_helper((QString *)local_88);
                  pQVar8 = (QString *)local_88._8_8_;
                  if ((QString *)local_88._8_8_ == (QString *)0x0) {
                    pQVar8 = (QString *)&QByteArray::_empty;
                  }
                  iVar4 = system((char *)pQVar8);
                  if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_88._0_8_)->d).d =
                         *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
                    }
                  }
                  iVar3 = 1;
                  if (iVar4 == 0) {
                    iVar3 = 0xe;
                  }
                  if (&(local_168.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_168.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_168.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_168.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_168.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_148.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_148.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_148.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_148.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_148.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                if (&(local_128.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_128.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_128.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if (((local_128.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_128.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_d8.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if (((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_d8.d)->super_QArrayData,2,0x10);
                  }
                }
                if (iVar3 != 0) goto LAB_00162b5d;
              }
              pPVar12 = pPVar12 + 1;
            } while (pPVar12 !=
                     (pPVar10->super_QList<ProString>).d.ptr +
                     (pPVar10->super_QList<ProString>).d.size);
            iVar3 = 0xe;
LAB_00162b5d:
            pPVar7 = (ProStringList *)CONCAT62(uVar21,uVar20);
            if (iVar3 != 0xe) {
              bVar1 = false;
              goto LAB_00162bd8;
            }
          }
          pPVar11 = pPVar11 + 1;
        } while (pPVar11 !=
                 (pPVar7->super_QList<ProString>).d.ptr + (pPVar7->super_QList<ProString>).d.size);
        bVar1 = true;
      }
LAB_00162bd8:
      if ((ProString *)local_228.m_string.d.d != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_228.m_string.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_228.m_string.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_228.m_string.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_228.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((ProString *)local_108._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_108._0_8_)->d).d =
             *(int *)&(((QString *)local_108._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_108._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
        }
      }
    }
    else {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffff90 = &DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar22 = this->project;
      local_108._8_8_ = ".output";
      local_108._0_8_ = comp;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                ((ProString *)local_b8,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)local_108);
      QMakeEvaluator::first((ProString *)local_88,&pQVar22->super_QMakeEvaluator,(ProKey *)local_b8)
      ;
      if ((ProString *)local_b8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_b8._0_8_)->d).d =
             *(int *)&(((QString *)local_b8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_b8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      if (iStack_6c != 0) {
        local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar22 = this->project;
        local_108._8_8_ = ".verify_function";
        local_108._0_8_ = comp;
        ProString::ProString<ProString_const&,char_const(&)[17]>
                  ((ProString *)local_b8,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[17]> *)local_108);
        pPVar7 = QMakeEvaluator::valuesRef(&pQVar22->super_QMakeEvaluator,(ProKey *)local_b8);
        local_d8.d = (pPVar7->super_QList<ProString>).d.d;
        local_d8.ptr = (pPVar7->super_QList<ProString>).d.ptr;
        local_d8.size = (pPVar7->super_QList<ProString>).d.size;
        if (&(local_d8.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_d8.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_d8.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pQVar18 = pQVar5;
        if ((ProString *)local_b8._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8._0_8_)->d).d =
               *(int *)&(((QString *)local_b8._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_b8._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
          }
        }
        if ((undefined1 *)local_d8.size != (undefined1 *)0x0) {
          if ((undefined1 *)local_d8.size == (undefined1 *)0x0) {
            bVar1 = true;
          }
          else {
            puVar9 = (undefined1 *)0x0;
            do {
              local_98 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              ProString::ProString((ProString *)local_b8,local_d8.ptr + (long)puVar9);
              pQVar8 = (QString *)local_b8._8_8_;
              if ((QString *)local_b8._8_8_ == (QString *)0x0) {
                pQVar8 = (QString *)&QString::_empty;
              }
              sVar19 = *(short *)((long)&(pQVar8->d).d + (long)(int)local_b8._24_4_ * 2);
              if (sVar19 == 0x21) {
                ProString::mid((ProString *)local_108,(ProString *)local_b8,1,-1);
                QString::operator=((QString *)local_b8,(QString *)local_108);
                puStack_90 = local_e0;
                local_b8._24_8_ = local_108._24_8_;
                local_98 = puStack_e8;
                if ((ProString *)local_108._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_108._0_8_)->d).d =
                       *(int *)&(((QString *)local_108._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_108._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
                  }
                }
              }
              qVar6 = QtPrivate::indexOf<ProString,char[8]>(pQVar5,(char (*) [8])"combine",0);
              pQVar22 = this->project;
              if (qVar6 == -1) {
                local_228.m_string.d.ptr = L".input";
                local_228.m_string.d.d = (Data *)comp;
                ProString::ProString<ProString_const&,char_const(&)[7]>
                          ((ProString *)local_108,
                           (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_228);
                pPVar7 = QMakeEvaluator::valuesRef
                                   (&pQVar22->super_QMakeEvaluator,(ProKey *)local_108);
                pQVar5 = pQVar18;
                if ((ProString *)local_108._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_108._0_8_)->d).d =
                       *(int *)&(((QString *)local_108._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_108._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
                    pQVar5 = pQVar18;
                  }
                }
                if ((pPVar7->super_QList<ProString>).d.size != 0) {
                  pPVar11 = (pPVar7->super_QList<ProString>).d.ptr;
                  do {
                    pPVar10 = QMakeEvaluator::valuesRef
                                        (&this->project->super_QMakeEvaluator,(ProKey *)pPVar11);
                    if ((pPVar10->super_QList<ProString>).d.size != 0) {
                      pPVar12 = (pPVar10->super_QList<ProString>).d.ptr;
                      do {
                        if (pPVar12->m_length != 0) {
                          local_128.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                          local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                          local_128.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
                          ProString::toQString((QString *)&local_128,pPVar12);
                          local_148.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                          local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                          local_148.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
                          iVar3 = 0;
                          fileFixify((QString *)&local_148,this,(QString *)&local_128,
                                     (FileFixifyTypes)0x0,true);
                          if ((local_148.size == local_58.d.size) &&
                             (QVar14.m_data = (storage_type_conflict *)local_148.ptr,
                             QVar14.m_size = local_148.size, QVar16.m_data = local_58.d.ptr,
                             QVar16.m_size = local_58.d.size,
                             cVar2 = QtPrivate::equalStrings(QVar14,QVar16), cVar2 != '\0')) {
                            pQVar22 = this->project;
                            local_168.size = 0;
                            local_168.d = (Data *)0x0;
                            local_168.ptr = (ProStringList *)0x0;
                            ProString::toQString(&local_1b8,(ProString *)local_88);
                            local_1d8.d.size = 0;
                            local_1d8.d.d = (Data *)0x0;
                            local_1d8.d.ptr = (char16_t *)0x0;
                            local_108._0_8_ = (ProString *)0x0;
                            local_108._8_8_ = (char (*) [17])0x0;
                            local_108._16_8_ = (undefined1 *)0x0;
                            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                                      ((QMovableArrayOps<QString> *)local_108,0,
                                       (QString *)&local_128);
                            QList<QString>::end((QList<QString> *)local_108);
                            local_228.m_string.d.d = (Data *)0x0;
                            local_228.m_string.d.ptr = (char16_t *)0x0;
                            local_228.m_string.d.size = 0;
                            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                                      ((QMovableArrayOps<QString> *)&local_228,0,&local_1d8);
                            QList<QString>::end((QList<QString> *)&local_228);
                            (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xb])
                                      (&local_1a0,this,&local_1b8,(ProString *)local_108,&local_228,
                                       0);
                            QArrayDataPointer<QString>::~QArrayDataPointer
                                      ((QArrayDataPointer<QString> *)&local_228);
                            QArrayDataPointer<QString>::~QArrayDataPointer
                                      ((QArrayDataPointer<QString> *)local_108);
                            ProString::ProString((ProString *)local_108,&local_1a0);
                            local_188.d = (Data *)0x0;
                            local_188.ptr = (ProString *)0x0;
                            local_188.size = 0;
                            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                                      ((QMovableArrayOps<ProString> *)&local_188,0,
                                       (ProString *)local_108);
                            QList<ProString>::end((QList<ProString> *)&local_188);
                            QtPrivate::QMovableArrayOps<ProStringList>::emplace<ProStringList>
                                      ((QMovableArrayOps<ProStringList> *)&local_168,local_168.size,
                                       (ProStringList *)&local_188);
                            QList<ProStringList>::end((QList<ProStringList> *)&local_168);
                            ProString::ProString(&local_228,&local_58);
                            local_1f8.d = (Data *)0x0;
                            local_1f8.ptr = (ProString *)0x0;
                            local_1f8.size = 0;
                            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                                      ((QMovableArrayOps<ProString> *)&local_1f8,0,&local_228);
                            QList<ProString>::end((QList<ProString> *)&local_1f8);
                            QtPrivate::QMovableArrayOps<ProStringList>::emplace<ProStringList>
                                      ((QMovableArrayOps<ProStringList> *)&local_168,local_168.size,
                                       (ProStringList *)&local_1f8);
                            QList<ProStringList>::end((QList<ProStringList> *)&local_168);
                            bVar1 = QMakeProject::test(pQVar22,(ProKey *)local_b8,
                                                       (QList<ProStringList> *)&local_168);
                            QArrayDataPointer<ProString>::~QArrayDataPointer(&local_1f8);
                            if ((ProString *)local_228.m_string.d.d != (ProString *)0x0) {
                              LOCK();
                              *(int *)&(((QString *)&(local_228.m_string.d.d)->super_QArrayData)->d)
                                       .d = *(int *)&(((QString *)
                                                      &(local_228.m_string.d.d)->super_QArrayData)->
                                                     d).d + -1;
                              UNLOCK();
                              if (*(int *)&(((QString *)&(local_228.m_string.d.d)->super_QArrayData)
                                           ->d).d == 0) {
                                QArrayData::deallocate
                                          (&(local_228.m_string.d.d)->super_QArrayData,2,0x10);
                              }
                            }
                            QArrayDataPointer<ProString>::~QArrayDataPointer(&local_188);
                            if ((ProString *)local_108._0_8_ != (ProString *)0x0) {
                              LOCK();
                              *(int *)&(((QString *)local_108._0_8_)->d).d =
                                   *(int *)&(((QString *)local_108._0_8_)->d).d + -1;
                              UNLOCK();
                              if (*(int *)&(((QString *)local_108._0_8_)->d).d == 0) {
                                QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
                              }
                            }
                            if (&(local_1a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                              LOCK();
                              ((local_1a0.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i =
                                   ((local_1a0.d.d)->super_QArrayData).ref_._q_value.
                                   super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if (((local_1a0.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate(&(local_1a0.d.d)->super_QArrayData,2,0x10);
                              }
                            }
                            if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                              LOCK();
                              ((local_1d8.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i =
                                   ((local_1d8.d.d)->super_QArrayData).ref_._q_value.
                                   super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
                              }
                            }
                            if (&(local_1b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                              LOCK();
                              ((local_1b8.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i =
                                   ((local_1b8.d.d)->super_QArrayData).ref_._q_value.
                                   super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if (((local_1b8.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate(&(local_1b8.d.d)->super_QArrayData,2,0x10);
                              }
                            }
                            bVar13 = sVar19 == 0x21;
                            QArrayDataPointer<ProStringList>::~QArrayDataPointer(&local_168);
                            iVar3 = 1;
                            if (bVar13 != bVar1) {
                              iVar3 = 8;
                            }
                          }
                          if (&(local_148.d)->super_QArrayData != (QArrayData *)0x0) {
                            LOCK();
                            ((local_148.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                            ._M_i = ((local_148.d)->super_QArrayData).ref_._q_value.
                                    super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if (((local_148.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate(&(local_148.d)->super_QArrayData,2,0x10);
                            }
                          }
                          if (&(local_128.d)->super_QArrayData != (QArrayData *)0x0) {
                            LOCK();
                            ((local_128.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                            ._M_i = ((local_128.d)->super_QArrayData).ref_._q_value.
                                    super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if (((local_128.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate(&(local_128.d)->super_QArrayData,2,0x10);
                            }
                          }
                          if (iVar3 != 0) goto LAB_00162328;
                        }
                        pPVar12 = pPVar12 + 1;
                      } while (pPVar12 !=
                               (pPVar10->super_QList<ProString>).d.ptr +
                               (pPVar10->super_QList<ProString>).d.size);
                    }
                    iVar3 = 8;
LAB_00162328:
                    if (iVar3 != 8) goto LAB_0016235b;
                    pPVar11 = pPVar11 + 1;
                  } while (pPVar11 !=
                           (pPVar7->super_QList<ProString>).d.ptr +
                           (pPVar7->super_QList<ProString>).d.size);
                }
                iVar3 = 5;
LAB_0016235b:
                if (iVar3 == 5) goto LAB_00161e58;
              }
              else {
                local_228.m_string.d.d = (Data *)0x0;
                local_228.m_string.d.ptr = (char16_t *)0x0;
                local_228.m_string.d.size = 0;
                local_128.d = (Data *)0x0;
                local_128.ptr = (ProString *)0x0;
                local_128.size = 0;
                QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                          ((QMovableArrayOps<ProString> *)&local_128,0,(ProString *)local_88);
                QList<ProString>::end((QList<ProString> *)&local_128);
                QtPrivate::QMovableArrayOps<ProStringList>::emplace<ProStringList>
                          ((QMovableArrayOps<ProStringList> *)&local_228,local_228.m_string.d.size,
                           (ProStringList *)&local_128);
                QList<ProStringList>::end((QList<ProStringList> *)&local_228);
                ProString::ProString((ProString *)local_108,&local_58);
                local_148.d = (Data *)0x0;
                local_148.ptr = (ProString *)0x0;
                local_148.size = 0;
                QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                          ((QMovableArrayOps<ProString> *)&local_148,0,(ProString *)local_108);
                QList<ProString>::end((QList<ProString> *)&local_148);
                QtPrivate::QMovableArrayOps<ProStringList>::emplace<ProStringList>
                          ((QMovableArrayOps<ProStringList> *)&local_228,local_228.m_string.d.size,
                           (ProStringList *)&local_148);
                QList<ProStringList>::end((QList<ProStringList> *)&local_228);
                bVar1 = QMakeProject::test(pQVar22,(ProKey *)local_b8,
                                           (QList<ProStringList> *)&local_228);
                QArrayDataPointer<ProString>::~QArrayDataPointer(&local_148);
                pQVar5 = pQVar18;
                if ((ProString *)local_108._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_108._0_8_)->d).d =
                       *(int *)&(((QString *)local_108._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_108._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
                    pQVar5 = pQVar18;
                  }
                }
                QArrayDataPointer<ProString>::~QArrayDataPointer(&local_128);
                QArrayDataPointer<ProStringList>::~QArrayDataPointer
                          ((QArrayDataPointer<ProStringList> *)&local_228);
                iVar3 = 1;
                if ((sVar19 == 0x21) != bVar1) {
LAB_00161e58:
                  iVar3 = 0;
                }
              }
              pQVar18 = pQVar5;
              if ((ProString *)local_b8._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_b8._0_8_)->d).d =
                     *(int *)&(((QString *)local_b8._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_b8._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
                }
              }
              if (iVar3 != 0) goto LAB_0016268a;
              puVar9 = puVar9 + 1;
            } while (puVar9 < (ulong)local_d8.size);
            iVar3 = 2;
LAB_0016268a:
            bVar1 = iVar3 == 2;
          }
          QArrayDataPointer<ProString>::~QArrayDataPointer(&local_d8);
          if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_88._0_8_)->d).d =
                 *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          if (!bVar1) goto LAB_001626cf;
          goto LAB_001626ca;
        }
        QArrayDataPointer<ProString>::~QArrayDataPointer(&local_d8);
      }
      if ((ProString *)local_88._0_8_ == (ProString *)0x0) goto LAB_001626cf;
      LOCK();
      ((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i =
           ((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i + -1;
      iVar3 = ((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i;
      UNLOCK();
      pPVar11 = (ProString *)local_88._0_8_;
joined_r0x00162639:
      if (iVar3 == 0) {
        QArrayData::deallocate((QArrayData *)pPVar11,2,0x10);
      }
LAB_001626cf:
      bVar1 = false;
    }
  }
  else {
    if (local_58.d.ptr != (storage_type_conflict *)0x0) {
      QMakeSourceFileInfo::addSourceFile(&this->super_QMakeSourceFileInfo,&local_58,'\x02',TYPE_C);
      bVar1 = QMakeSourceFileInfo::mocable(&this->super_QMakeSourceFileInfo,&local_58);
      if (!bVar1) goto LAB_001626cf;
      pQVar22 = this->project;
      ProKey::ProKey((ProKey *)local_88,"MOCABLES");
      pQVar5 = &QMakeEvaluator::valuesRef(&pQVar22->super_QMakeEvaluator,(ProKey *)local_88)->
                super_QList<ProString>;
      ProString::ProString((ProString *)local_b8,&local_58);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar5,(pQVar5->d).size,(ProString *)local_b8);
      QList<ProString>::end(pQVar5);
      if ((ProString *)local_b8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_b8._0_8_)->d).d =
             *(int *)&(((QString *)local_b8._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_b8._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i =
             ((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i + -1;
        iVar3 = ((__atomic_base<int> *)&(((QString *)local_88._0_8_)->d).d)->_M_i;
        UNLOCK();
        pPVar11 = (ProString *)local_88._0_8_;
joined_r0x00162bc3:
        if (iVar3 == 0) {
          QArrayData::deallocate((QArrayData *)pPVar11,2,0x10);
        }
      }
    }
LAB_001626ca:
    bVar1 = true;
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_001626fa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool
MakefileGenerator::verifyExtraCompiler(const ProString &comp, const QString &file_unfixed)
{
    if(noIO())
        return false;
    const QString file = Option::normalizePath(file_unfixed);

    const ProStringList &config = project->values(ProKey(comp + ".CONFIG"));
    if (config.indexOf("moc_verify") != -1) {
        if(!file.isNull()) {
            QMakeSourceFileInfo::addSourceFile(file, QMakeSourceFileInfo::SEEK_MOCS);
            if(!mocable(file)) {
                return false;
            } else {
                project->values("MOCABLES").append(file);
            }
        }
    } else if (config.indexOf("function_verify") != -1) {
        ProString tmp_out = project->first(ProKey(comp + ".output"));
        if(tmp_out.isEmpty())
            return false;
        ProStringList verify_function = project->values(ProKey(comp + ".verify_function"));
        if(verify_function.isEmpty())
            return false;

        for(int i = 0; i < verify_function.size(); ++i) {
            bool invert = false;
            ProString verify = verify_function.at(i);
            if(verify.at(0) == QLatin1Char('!')) {
                invert = true;
                verify = verify.mid(1);
            }

            if (config.indexOf("combine") != -1) {
                bool pass = project->test(verify.toKey(), QList<ProStringList>() << ProStringList(tmp_out) << ProStringList(file));
                if(invert)
                    pass = !pass;
                if(!pass)
                    return false;
            } else {
                const ProStringList &tmp = project->values(ProKey(comp + ".input"));
                for (ProStringList::ConstIterator it = tmp.begin(); it != tmp.end(); ++it) {
                    const ProStringList &inputs = project->values((*it).toKey());
                    for (ProStringList::ConstIterator input = inputs.begin(); input != inputs.end(); ++input) {
                        if((*input).isEmpty())
                            continue;
                        QString inpf = (*input).toQString();
                        QString in = fileFixify(inpf);
                        if(in == file) {
                            bool pass = project->test(verify.toKey(),
                                                      QList<ProStringList>() << ProStringList(replaceExtraCompilerVariables(tmp_out.toQString(), inpf, QString(), NoShell)) <<
                                                      ProStringList(file));
                            if(invert)
                                pass = !pass;
                            if(!pass)
                                return false;
                            break;
                        }
                    }
                }
            }
        }
    } else if (config.indexOf("verify") != -1) {
        QString tmp_out = project->first(ProKey(comp + ".output")).toQString();
        if(tmp_out.isEmpty())
            return false;
        const QString tmp_cmd = project->values(ProKey(comp + ".commands")).join(' ');
        if (config.indexOf("combine") != -1) {
            QString cmd = replaceExtraCompilerVariables(tmp_cmd, QString(), tmp_out, LocalShell);
            if(system(cmd.toLatin1().constData()))
                return false;
        } else {
            const ProStringList &tmp = project->values(ProKey(comp + ".input"));
            for (ProStringList::ConstIterator it = tmp.begin(); it != tmp.end(); ++it) {
                const ProStringList &inputs = project->values((*it).toKey());
                for (ProStringList::ConstIterator input = inputs.begin(); input != inputs.end(); ++input) {
                    if((*input).isEmpty())
                        continue;
                    QString inpf = (*input).toQString();
                    QString in = fileFixify(inpf);
                    if(in == file) {
                        QString out = replaceExtraCompilerVariables(tmp_out, inpf, QString(), NoShell);
                        QString cmd = replaceExtraCompilerVariables(tmp_cmd, in, out, LocalShell);
                        if(system(cmd.toLatin1().constData()))
                            return false;
                        break;
                    }
                }
            }
        }
    }
    return true;
}